

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O1

void __thiscall Vector<Fad<double>_>::resize(Vector<Fad<double>_> *this,int ssize)

{
  double dVar1;
  long *plVar2;
  Fad<double> *pFVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (ssize == 0) {
    if (this->num_elts != 0) {
      pFVar3 = this->ptr_to_data;
      if (pFVar3 != (Fad<double> *)0x0) {
        dVar1 = pFVar3[-1].defaultVal;
        if (dVar1 != 0.0) {
          lVar4 = (long)dVar1 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar3[-1].val_ + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__(&pFVar3[-1].defaultVal,(long)dVar1 << 5 | 8);
      }
      this->num_elts = 0;
      this->ptr_to_data = (Fad<double> *)0x0;
    }
  }
  else {
    if (this->num_elts != 0) {
      pFVar3 = this->ptr_to_data;
      if (pFVar3 != (Fad<double> *)0x0) {
        dVar1 = pFVar3[-1].defaultVal;
        if (dVar1 != 0.0) {
          lVar4 = (long)dVar1 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar3[-1].val_ + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__(&pFVar3[-1].defaultVal,(long)dVar1 << 5 | 8);
      }
      this->num_elts = 0;
      this->ptr_to_data = (Fad<double> *)0x0;
    }
    this->num_elts = ssize;
    lVar4 = (long)ssize * 0x20;
    uVar6 = 0xffffffffffffffff;
    if (-1 < ssize) {
      uVar6 = lVar4 + 8;
    }
    plVar2 = (long *)operator_new__(uVar6);
    *plVar2 = (long)ssize;
    lVar5 = 0;
    pFVar3 = (Fad<double> *)(plVar2 + 1);
    do {
      Fad<double>::Fad(pFVar3);
      lVar5 = lVar5 + -0x20;
      pFVar3 = pFVar3 + 1;
    } while (-lVar5 != lVar4);
    this->ptr_to_data = (Fad<double> *)(plVar2 + 1);
  }
  return;
}

Assistant:

inline void Vector< T >::resize(int ssize)
{
#ifdef CHECK_SIZE
    if ( ssize <0 ) error("Vector<>::reserve(), negative size");
#endif

    if ( ssize != 0){
      if ( num_elts != 0) destroy();

      num_elts = ssize;
      ptr_to_data = new T[num_elts];              
      
      if ( ptr_to_data == 0 ) error("Vector<>::reserve(), not enough memory");

    }
    else
      if ( num_elts != 0) destroy();

#ifdef DEBUG
    fprintf(stderr,"Vector<>::reserve()         |                   | adr =  %x \n", ptr_to_data);
#endif
}